

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O0

void __thiscall
dit::(anonymous_namespace)::ConstantInterpolationTest::runCase(dit::(anonymous_namespace)::
ConstantInterpolationTest::SubCase_const&)::FragShader::shadeFragments(rr::FragmentPacket*,int,rr::
FragmentShadingContext_const___const
          (void *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  undefined1 local_40 [8];
  Vec4 interp;
  int fragNdx;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  FragShader *this_local;
  
  for (interp.m_data[3] = 0.0; (int)interp.m_data[3] < numPackets;
      interp.m_data[3] = (float)((int)interp.m_data[3] + 1)) {
    for (interp.m_data[2] = 0.0; (int)interp.m_data[2] < 4;
        interp.m_data[2] = (float)((int)interp.m_data[2] + 1)) {
      rr::readTriangleVarying<float>
                ((rr *)local_40,packets + (int)interp.m_data[3],context,0,(int)interp.m_data[2]);
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                (context,(int)interp.m_data[3],(int)interp.m_data[2],0,(Vector<float,_4> *)local_40)
      ;
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
				{
					for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
					{
						for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
						{
							const tcu::Vec4 interp = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
							rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, interp);
						}
					}
				}